

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsClutch.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsClutch::ChShaftsClutch(ChShaftsClutch *this,ChShaftsClutch *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  ChShaftsCouple::ChShaftsCouple(&this->super_ChShaftsCouple,&other->super_ChShaftsCouple);
  (this->super_ChShaftsCouple).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsClutch_0116e828;
  this->active = true;
  ChConstraintTwoGenericBoxed::ChConstraintTwoGenericBoxed(&this->constraint);
  dVar1 = other->minT;
  dVar2 = other->modulation;
  dVar3 = other->torque_react;
  this->maxT = other->maxT;
  this->minT = dVar1;
  this->modulation = dVar2;
  this->torque_react = dVar3;
  return;
}

Assistant:

ChShaftsClutch::ChShaftsClutch(const ChShaftsClutch& other) : ChShaftsCouple(other), active(true) {
    maxT = other.maxT;
    minT = other.minT;
    modulation = other.modulation;
    torque_react = other.torque_react;
}